

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_xattr.c
# Opt level: O0

void archive_entry_xattr_clear(archive_entry *entry)

{
  undefined8 uVar1;
  long in_RDI;
  ae_xattr *xp;
  
  while (*(long *)(in_RDI + 0x400) != 0) {
    uVar1 = **(undefined8 **)(in_RDI + 0x400);
    free(*(void **)(*(long *)(in_RDI + 0x400) + 8));
    free(*(void **)(*(long *)(in_RDI + 0x400) + 0x10));
    free(*(void **)(in_RDI + 0x400));
    *(undefined8 *)(in_RDI + 0x400) = uVar1;
  }
  *(undefined8 *)(in_RDI + 0x400) = 0;
  return;
}

Assistant:

void
archive_entry_xattr_clear(struct archive_entry *entry)
{
	struct ae_xattr	*xp;

	while (entry->xattr_head != NULL) {
		xp = entry->xattr_head->next;
		free(entry->xattr_head->name);
		free(entry->xattr_head->value);
		free(entry->xattr_head);
		entry->xattr_head = xp;
	}

	entry->xattr_head = NULL;
}